

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_tattle_global(REF_NODE ref_node,REF_INT global)

{
  uint uVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  undefined8 uVar7;
  REF_INT local_from_sorted;
  
  uVar1 = ref_node_local(ref_node,(long)global,&local_from_sorted);
  if (uVar1 == 0) {
    uVar2 = 1;
  }
  else {
    uVar2 = 0;
    if (uVar1 != 5) {
      pcVar6 = "local search";
      uVar2 = 0x106;
LAB_001647d8:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar2,
             "ref_node_tattle_global",(ulong)uVar1,pcVar6);
      return uVar1;
    }
  }
  uVar4 = 0;
  uVar3 = (ulong)(uint)ref_node->max;
  if (ref_node->max < 1) {
    uVar3 = uVar4;
  }
  uVar5 = 0xffffffffffffffff;
  uVar7 = 0;
  do {
    if (uVar3 == uVar4) {
      printf("%d: global %d: search%d %d exhaust%d %d\n",(ulong)(uint)ref_node->ref_mpi->id,global,
             uVar2,(ulong)(uint)local_from_sorted,uVar7,(int)uVar5);
      return 0;
    }
    if (ref_node->global[uVar4] == (long)global && -1 < ref_node->global[uVar4]) {
      if ((int)uVar7 != 0) {
        pcVar6 = "twice";
        uVar1 = 1;
        uVar2 = 0x10e;
        goto LAB_001647d8;
      }
      uVar7 = 1;
      uVar5 = uVar4 & 0xffffffff;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_node_tattle_global(REF_NODE ref_node, REF_INT global) {
  REF_INT local_from_sorted;
  REF_INT local_from_exhaustive;
  REF_BOOL found_from_sorted;
  REF_BOOL found_from_exhaustive;
  REF_INT node;

  REF_STATUS ref_status;

  ref_status = ref_node_local(ref_node, global, &local_from_sorted);
  if (REF_NOT_FOUND == ref_status) {
    found_from_sorted = REF_FALSE;
  } else {
    RSS(ref_status, "local search");
    found_from_sorted = REF_TRUE;
  }

  found_from_exhaustive = REF_FALSE;
  local_from_exhaustive = REF_EMPTY;
  each_ref_node_valid_node(ref_node, node) {
    if (global == ref_node_global(ref_node, node)) {
      if (found_from_exhaustive) RSS(REF_FAILURE, "twice");
      local_from_exhaustive = node;
      found_from_exhaustive = REF_TRUE;
    }
  }

  printf("%d: global %d: search%d %d exhaust%d %d\n",
         ref_mpi_rank(ref_node_mpi(ref_node)), global, found_from_sorted,
         local_from_sorted, found_from_exhaustive, local_from_exhaustive);

  return REF_SUCCESS;
}